

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_dialog(t_my_numbox *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _glist *canvas;
  uint uVar2;
  t_symbol *s_00;
  int iVar3;
  int iVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  t_symbol *srl [3];
  t_atom undo [18];
  t_symbol *local_178 [4];
  t_atom local_158 [2];
  undefined4 local_138;
  float local_130;
  undefined4 local_128;
  float local_120;
  undefined4 local_118;
  float local_110;
  undefined4 local_f8;
  float local_f0;
  
  tVar5 = atom_getfloatarg(0,argc,argv);
  tVar6 = atom_getfloatarg(1,argc,argv);
  tVar7 = atom_getfloatarg(2,argc,argv);
  tVar8 = atom_getfloatarg(3,argc,argv);
  tVar9 = atom_getfloatarg(4,argc,argv);
  tVar10 = atom_getfloatarg(6,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,local_158);
  local_158[0].a_type = A_FLOAT;
  local_158[0].a_w._0_4_ = (undefined4)x->x_numwidth;
  local_138 = 1;
  local_130 = (float)x->x_min;
  local_128 = 1;
  local_120 = (float)x->x_max;
  local_118 = 1;
  local_110 = (float)x->x_lin0_log1;
  local_f8 = 1;
  local_f0 = (float)x->x_log_height;
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,local_158,argc,argv);
  x->x_lin0_log1 = (uint)((int)tVar9 != 0);
  iemgui_dialog(&x->x_gui,local_178,argc,argv);
  uVar2 = 8;
  if (8 < (int)tVar6) {
    uVar2 = (int)tVar6;
  }
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_h = iVar1 * uVar2;
  uVar11 = -(uint)(1 < (int)tVar5);
  uVar13 = -(uint)(10 < (int)tVar10);
  uVar12 = ~uVar11 & 1 | (int)tVar5 & uVar11;
  x->x_numwidth = uVar12;
  x->x_log_height = ~uVar13 & 10 | (int)tVar10 & uVar13;
  uVar11 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar4 = 0x1f;
  if (uVar11 == 2) {
    iVar4 = 0x19;
  }
  iVar3 = 0x1b;
  if (uVar11 != 1) {
    iVar3 = iVar4;
  }
  (x->x_gui).x_w = ((uVar2 >> 1) + (int)(uVar12 * (x->x_gui).x_fontsize * iVar3) / 0x24 + 4) * iVar1
  ;
  my_numbox_check_minmax(x,(double)tVar7,(double)tVar8);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_numbox_dialog(t_my_numbox *x, t_symbol *s, int argc,
    t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    double min = (double)atom_getfloatarg(2, argc, argv);
    double max = (double)atom_getfloatarg(3, argc, argv);
    int lilo = (int)atom_getfloatarg(4, argc, argv);
    int log_height = (int)atom_getfloatarg(6, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+0, x->x_numwidth);
    SETFLOAT(undo+2, x->x_min);
    SETFLOAT(undo+3, x->x_max);
    SETFLOAT(undo+4, x->x_lin0_log1);
    SETFLOAT(undo+6, x->x_log_height);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(h < IEM_GUI_MINSIZE)
        h = IEM_GUI_MINSIZE;
    x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    if(log_height < 10)
        log_height = 10;
    x->x_log_height = log_height;
    my_numbox_calc_fontwidth(x);
    /*if(my_numbox_check_minmax(x, min, max))
     my_numbox_bang(x);*/
    my_numbox_check_minmax(x, min, max);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    iemgui_size(x, &x->x_gui);
}